

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFloat.hpp
# Opt level: O1

Float<unsigned_long,_11,_52,_1023,_3U>
tcu::Float<unsigned_long,11,52,1023,3u>::convert<unsigned_int,5,5,15,2u>
          (Float<unsigned_int,_5,_5,_15,_2U> *other)

{
  uint uVar1;
  long lVar2;
  Float<unsigned_long,_11,_52,_1023,_3U> FVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  
  uVar1 = other->m_value;
  if ((uVar1 & 0x3ff) == 0x3e0) {
    FVar3.m_value = 0xfff0000000000000;
    if ((uVar1 >> 10 & 1) == 0) {
      FVar3.m_value = 0x7ff0000000000000;
    }
    return (Float<unsigned_long,_11,_52,_1023,_3U>)FVar3.m_value;
  }
  uVar6 = uVar1 & 0x1f;
  if ((uVar1 & 0x3e0) == 0x3e0 && uVar6 != 0) {
    return (Float<unsigned_long,_11,_52,_1023,_3U>)0x7fffffffffffffff;
  }
  if ((uVar1 & 0x3ff) != 0) {
    iVar4 = (uVar1 >> 5 & 0x1f) - 0xf;
    uVar5 = uVar6 + 0x20;
    if ((uVar1 & 0x3e0) == 0 && uVar6 != 0) {
      lVar2 = 0x3f;
      if (uVar6 != 0) {
        for (; uVar6 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      uVar5 = uVar6 << (~(byte)lVar2 + 6 & 0x3f);
      iVar4 = 0x2c - ((uint)lVar2 ^ 0x3f);
    }
    return (Float<unsigned_long,_11,_52,_1023,_3U>)
           ((ulong)(iVar4 + 0x3ff) << 0x34 | (ulong)(uVar5 & 0xffdf) << 0x2f |
           (ulong)(uVar1 & 0x400) << 0x35);
  }
  return (Float<unsigned_long,_11,_52,_1023,_3U>)((ulong)uVar1 << 0x35);
}

Assistant:

inline StorageType		exponentBits	(void) const	{ return (m_value >> MantissaBits) & ((StorageType(1)<<ExponentBits)-1);	}